

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CrossIdBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>(BumpAllocator *this)

{
  CrossIdBinsSelectExpr *pCVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  
  pCVar1 = (CrossIdBinsSelectExpr *)allocate(in_stack_00000008,unaff_retaddr,in_RDI);
  ast::CrossIdBinsSelectExpr::CrossIdBinsSelectExpr((CrossIdBinsSelectExpr *)0x415f9a);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }